

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConstraintDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::ConstraintDeclarationSyntax_const&>
          (BumpAllocator *this,ConstraintDeclarationSyntax *args)

{
  ConstraintDeclarationSyntax *this_00;
  
  this_00 = (ConstraintDeclarationSyntax *)allocate(this,0xe0,8);
  syntax::ConstraintDeclarationSyntax::ConstraintDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }